

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O0

int __thiscall ncnn::Normalize::forward(Normalize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  long in_RSI;
  long in_RDI;
  float fVar4;
  double dVar5;
  int i_8;
  float scale_4;
  float *outptr_4;
  float *ptr_7;
  int q_8;
  float *ptr_6;
  int q_7;
  float ssum_4;
  int i_7;
  int i_6;
  float *outptr_3;
  float *ptr_5;
  int q_6;
  float *ptr_4;
  int q_5;
  float ssum_3;
  int i_5;
  float scale_3;
  Mat square_sum_blob_1;
  int i_4;
  float scale_2;
  float a_1;
  int i_3;
  float ssum_2;
  float *outptr_2;
  float *ptr_3;
  int q_4;
  int i_2;
  float scale_1;
  float *outptr_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *outptr;
  float *ptr_1;
  int q_2;
  float scale;
  float a;
  int q_1;
  float ssum;
  int i;
  float ssum_1;
  float *ptr;
  int q;
  Mat square_sum_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffff9b0;
  Mat *in_stack_fffffffffffff9b8;
  size_t in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  int _w;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  float local_5b8;
  int local_510;
  Mat local_508;
  float *local_4c8;
  Mat local_4c0;
  float *local_480;
  int local_474;
  Mat local_470;
  float *local_430;
  int local_428;
  float local_424;
  int local_420;
  int local_41c;
  Mat local_418;
  float *local_3d8;
  Mat local_3d0;
  float *local_390;
  int local_384;
  Mat local_380;
  float *local_340;
  int local_338;
  float local_334;
  int local_330;
  float local_32c;
  Mat local_328;
  int local_2e4;
  float local_2e0;
  float local_2dc;
  int local_2d8;
  float local_2d4;
  Mat local_2d0;
  float *local_290;
  Mat local_288;
  float *local_248;
  int local_23c;
  int local_238;
  float local_234;
  Mat local_230;
  float *local_1f0;
  Mat local_1e8;
  float *local_1a8;
  int local_1a0;
  int local_19c;
  Mat local_198;
  float *local_158;
  Mat local_150;
  float *local_110;
  int local_104;
  float local_100;
  float local_fc;
  int local_f8;
  float local_f4;
  int local_f0;
  float local_ec;
  Mat local_e8;
  float *local_a8;
  int local_9c;
  undefined4 local_98;
  Mat local_88;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c * local_30;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
              (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),(int)in_stack_fffffffffffff9c8,
              (int)(in_stack_fffffffffffff9c0 >> 0x20),(size_t)in_stack_fffffffffffff9b8,
              (Allocator *)in_stack_fffffffffffff9b0);
  _w = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
  bVar2 = Mat::empty(in_stack_fffffffffffff9b0);
  if (bVar2) {
    local_4 = -100;
  }
  else if ((*(int *)(in_RDI + 0x80) == 0) || (*(int *)(in_RDI + 0x84) == 0)) {
    if ((*(int *)(in_RDI + 0x80) == 0) || (*(int *)(in_RDI + 0x84) != 0)) {
      if ((*(int *)(in_RDI + 0x80) == 0) && (*(int *)(in_RDI + 0x84) != 0)) {
        Mat::Mat(&local_328);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),_w,
                    in_stack_fffffffffffff9c0,(Allocator *)in_stack_fffffffffffff9b8);
        bVar2 = Mat::empty(in_stack_fffffffffffff9b0);
        if (bVar2) {
          local_4 = -100;
        }
        else {
          if (*(int *)(in_RDI + 0x88) == 0) {
            for (local_420 = 0; local_420 < local_44; local_420 = local_420 + 1) {
              local_424 = *(float *)(in_RDI + 0x8c);
              for (local_428 = 0; local_428 < local_34; local_428 = local_428 + 1) {
                Mat::channel(in_stack_fffffffffffff9b8,
                             (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
                pfVar3 = Mat::operator_cast_to_float_(&local_470);
                Mat::~Mat((Mat *)0x179afc);
                local_424 = pfVar3[local_420] * pfVar3[local_420] + local_424;
                local_430 = pfVar3;
              }
              dVar5 = std::sqrt((double)(ulong)(uint)local_424);
              fVar4 = 1.0 / SUB84(dVar5,0);
              pfVar3 = Mat::operator[](&local_328,local_420);
              *pfVar3 = fVar4;
            }
            for (local_474 = 0; local_474 < local_34; local_474 = local_474 + 1) {
              Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20)
                          );
              pfVar3 = Mat::operator_cast_to_float_(&local_4c0);
              Mat::~Mat((Mat *)0x179c4d);
              local_480 = pfVar3;
              Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20)
                          );
              pfVar3 = Mat::operator_cast_to_float_(&local_508);
              Mat::~Mat((Mat *)0x179c99);
              local_4c8 = pfVar3;
              in_stack_fffffffffffff9b8 = (Mat *)Mat::operator[]((Mat *)(in_RDI + 0x98),local_474);
              fVar4 = *(float *)&in_stack_fffffffffffff9b8->data;
              for (local_510 = 0; local_510 < local_44; local_510 = local_510 + 1) {
                fVar1 = local_480[local_510];
                in_stack_fffffffffffff9b0 = (Mat *)Mat::operator[](&local_328,local_510);
                local_4c8[local_510] = fVar1 * *(float *)&in_stack_fffffffffffff9b0->data * fVar4;
              }
            }
          }
          else {
            pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
            local_32c = *pfVar3;
            for (local_330 = 0; local_330 < local_44; local_330 = local_330 + 1) {
              local_334 = *(float *)(in_RDI + 0x8c);
              for (local_338 = 0; local_338 < local_34; local_338 = local_338 + 1) {
                Mat::channel(in_stack_fffffffffffff9b8,
                             (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
                pfVar3 = Mat::operator_cast_to_float_(&local_380);
                Mat::~Mat((Mat *)0x1797bc);
                local_334 = pfVar3[local_330] * pfVar3[local_330] + local_334;
                local_340 = pfVar3;
              }
              dVar5 = std::sqrt((double)(ulong)(uint)local_334);
              fVar4 = (1.0 / SUB84(dVar5,0)) * local_32c;
              pfVar3 = Mat::operator[](&local_328,local_330);
              *pfVar3 = fVar4;
            }
            for (local_384 = 0; local_384 < local_34; local_384 = local_384 + 1) {
              Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20)
                          );
              pfVar3 = Mat::operator_cast_to_float_(&local_3d0);
              Mat::~Mat((Mat *)0x17991d);
              local_390 = pfVar3;
              Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20)
                          );
              pfVar3 = Mat::operator_cast_to_float_(&local_418);
              Mat::~Mat((Mat *)0x179969);
              local_3d8 = pfVar3;
              for (local_41c = 0; local_41c < local_44; local_41c = local_41c + 1) {
                fVar4 = local_390[local_41c];
                pfVar3 = Mat::operator[](&local_328,local_41c);
                local_3d8[local_41c] = fVar4 * *pfVar3;
              }
            }
          }
          local_4 = 0;
        }
        local_98 = 1;
        Mat::~Mat((Mat *)0x179df0);
      }
      else {
        local_4 = 0;
      }
    }
    else {
      for (local_23c = 0; local_23c < local_34; local_23c = local_23c + 1) {
        Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_288);
        Mat::~Mat((Mat *)0x1793a0);
        local_248 = pfVar3;
        Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_2d0);
        Mat::~Mat((Mat *)0x1793f8);
        local_2d4 = *(float *)(in_RDI + 0x8c);
        for (local_2d8 = 0; local_2d8 < local_44; local_2d8 = local_2d8 + 1) {
          local_2d4 = local_248[local_2d8] * local_248[local_2d8] + local_2d4;
        }
        local_290 = pfVar3;
        dVar5 = std::sqrt((double)(ulong)(uint)local_2d4);
        fVar4 = 1.0 / SUB84(dVar5,0);
        local_2dc = fVar4;
        if (*(int *)(in_RDI + 0x88) == 0) {
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),local_23c);
          local_5b8 = *pfVar3;
        }
        else {
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
          local_5b8 = *pfVar3;
        }
        local_2e0 = fVar4 * local_5b8;
        for (local_2e4 = 0; local_2e4 < local_44; local_2e4 = local_2e4 + 1) {
          local_290[local_2e4] = local_248[local_2e4] * local_2e0;
        }
      }
      local_4 = 0;
    }
  }
  else {
    Mat::Mat(&local_88);
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),_w,
                in_stack_fffffffffffff9c0,(Allocator *)in_stack_fffffffffffff9b8);
    bVar2 = Mat::empty(in_stack_fffffffffffff9b0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      for (local_9c = 0; local_9c < local_34; local_9c = local_9c + 1) {
        Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_e8);
        Mat::~Mat((Mat *)0x178d41);
        local_ec = 0.0;
        for (local_f0 = 0; fVar4 = local_ec, local_f0 < local_44; local_f0 = local_f0 + 1) {
          local_ec = pfVar3[local_f0] * pfVar3[local_f0] + local_ec;
        }
        local_a8 = pfVar3;
        pfVar3 = Mat::operator[](&local_88,local_9c);
        *pfVar3 = fVar4;
      }
      local_f4 = *(float *)(in_RDI + 0x8c);
      for (local_f8 = 0; local_f8 < local_34; local_f8 = local_f8 + 1) {
        pfVar3 = Mat::operator[](&local_88,local_f8);
        local_f4 = *pfVar3 + local_f4;
      }
      dVar5 = std::sqrt((double)(ulong)(uint)local_f4);
      fVar4 = 1.0 / SUB84(dVar5,0);
      local_fc = fVar4;
      if (*(int *)(in_RDI + 0x88) == 0) {
        for (local_1a0 = 0; local_1a0 < local_34; local_1a0 = local_1a0 + 1) {
          Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(&local_1e8);
          Mat::~Mat((Mat *)0x179159);
          local_1a8 = pfVar3;
          Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(&local_230);
          Mat::~Mat((Mat *)0x1791ab);
          fVar4 = local_fc;
          local_1f0 = pfVar3;
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),local_1a0);
          local_234 = fVar4 * *pfVar3;
          for (local_238 = 0; local_238 < local_44; local_238 = local_238 + 1) {
            local_1f0[local_238] = local_1a8[local_238] * local_234;
          }
        }
      }
      else {
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
        local_100 = fVar4 * *pfVar3;
        for (local_104 = 0; local_104 < local_34; local_104 = local_104 + 1) {
          Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(&local_150);
          Mat::~Mat((Mat *)0x178fc8);
          local_110 = pfVar3;
          Mat::channel(in_stack_fffffffffffff9b8,(int)((ulong)in_stack_fffffffffffff9b0 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(&local_198);
          Mat::~Mat((Mat *)0x17901a);
          for (local_19c = 0; local_19c < local_44; local_19c = local_19c + 1) {
            pfVar3[local_19c] = local_110[local_19c] * local_100;
          }
          local_158 = pfVar3;
        }
      }
      local_4 = 0;
    }
    local_98 = 1;
    Mat::~Mat((Mat *)0x1792f8);
  }
  return local_4;
}

Assistant:

int Normalize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);

            float ssum = 0.f;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        // sum + eps
        float ssum = eps;
        for (int q=0; q<channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        // 1 / sqrt(ssum)
        float a = 1.f / sqrt(ssum);

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            float ssum = eps;
            for (int i=0; i<size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a = 1.f / sqrt(ssum);
            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum) * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
            {
                float ssum = eps;
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                square_sum_blob[i] = 1.f / sqrt(ssum);
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                float scale = scale_data[q];

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}